

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O2

int Getc(FILE *inp)

{
  char cVar1;
  int iVar2;
  
  if (_stdin == inp) {
    iVar2 = 10;
    if ((pc != (char *)0x0) && (cVar1 = *pc, cVar1 != '\0')) {
      pc = pc + 1;
      iVar2 = (int)cVar1;
    }
    return iVar2;
  }
  iVar2 = getc((FILE *)inp);
  return iVar2;
}

Assistant:

static int Getc(inp)
	FILE *inp;
{
	if (inp != stdin) {
#if MAC
		int c = getc(inp);
		if (c == '\r') { c  = '\n';}
		return c;
#else
		return getc(inp);
#endif
	}else if (pc && *pc) {
		return (int)(*pc++);
	}else{
		return (int)('\n');
	}
}